

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O0

void __thiscall
PathTracerViewer::create_gen_graphics_pipeline
          (PathTracerViewer *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPushConstantRange> __l_00;
  initializer_list<VkPipelineShaderStageCreateInfo> __l_01;
  initializer_list<VkDynamicState> __l_02;
  element_type *this_00;
  GraphicsPipelineState pipeline_state;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  shared_ptr<myvk::ShaderModule> frag_shader_module;
  shared_ptr<myvk::ShaderModule> vert_shader_module;
  uint32_t kPathTracerViewerGenFragSpirv [460];
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> *in_stack_fffffffffffff3b8;
  GraphicsPipelineState *in_stack_fffffffffffff3c0;
  VkSpecializationInfo *in_stack_fffffffffffff3d0;
  VkShaderStageFlagBits in_stack_fffffffffffff3dc;
  ShaderModule *in_stack_fffffffffffff3e0;
  allocator_type *in_stack_fffffffffffff3e8;
  allocator_type *__a;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  *in_stack_fffffffffffff3f0;
  allocator<VkDynamicState> *this_01;
  iterator in_stack_fffffffffffff3f8;
  pointer pVVar1;
  size_type in_stack_fffffffffffff400;
  pointer pVVar2;
  undefined1 *puVar3;
  ColorBlendState *this_02;
  ColorBlendState *pCVar4;
  uint32_t code_size;
  ColorBlendState *code;
  Ptr<Device> *device_00;
  allocator<VkDynamicState> local_b71;
  undefined4 local_b70;
  undefined4 local_b6c;
  vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *in_stack_fffffffffffff498;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  *in_stack_fffffffffffff4a0;
  Ptr<Device> *in_stack_fffffffffffff4a8;
  VkStructureType local_b40;
  void *local_b38;
  VkPipelineRasterizationStateCreateFlags local_b30;
  VkBool32 local_b2c;
  VkBool32 local_b28;
  VkPolygonMode local_b24;
  VkCullModeFlags local_b20;
  VkFrontFace local_b1c;
  VkBool32 local_b18;
  float subpass;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 in_stack_fffffffffffff4fc;
  pointer render_pass;
  pointer pipeline_layout;
  InputAssemblyState local_a98;
  undefined4 local_a70;
  undefined8 local_a68;
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined1 local_a58;
  ViewportState local_a50;
  MultisampleState local_9e8;
  undefined4 local_9b0;
  undefined8 local_9a8;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  pointer pVStack_988;
  undefined4 uStack_980;
  undefined4 local_97c;
  undefined4 uStack_978;
  pointer pVStack_974;
  pointer pVStack_96c;
  undefined4 uStack_964;
  undefined4 local_960;
  undefined4 uStack_95c;
  pointer pVStack_958;
  undefined4 local_950;
  undefined4 local_94c;
  undefined1 local_948;
  pointer local_940;
  pointer pVStack_938;
  undefined8 local_930;
  undefined4 local_928;
  undefined8 local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined8 local_908;
  pointer local_900;
  pointer pVStack_8f8;
  undefined1 local_8f0;
  pointer local_8e8;
  pointer pVStack_8e0;
  undefined8 local_8d8;
  undefined4 local_8d0;
  undefined8 local_8c8;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined8 local_8b8;
  undefined1 local_8b0;
  allocator<VkPipelineShaderStageCreateInfo> local_8a1;
  undefined1 local_8a0 [96];
  undefined1 *local_840;
  undefined8 local_838;
  undefined1 local_808 [48];
  undefined1 local_7d8 [1843];
  undefined1 local_a5 [21];
  undefined8 local_90;
  allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> local_6d [13];
  undefined1 *local_60;
  undefined1 local_58 [24];
  VkPipelineColorBlendStateCreateInfo local_40;
  
  local_60 = local_58;
  this_00 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1749e0);
  PathTracer::GetTargetDescriptorSetLayout(this_00);
  std::shared_ptr<myvk::DescriptorSetLayout>::shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffff3c0,
             (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffff3b8);
  local_40.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_40._4_4_ = 0;
  local_58._16_8_ = (pointer)local_58;
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> *)0x174a40);
  __l._M_len = in_stack_fffffffffffff400;
  __l._M_array = (iterator)in_stack_fffffffffffff3f8;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)in_stack_fffffffffffff3f0,__l,(allocator_type *)in_stack_fffffffffffff3e8);
  local_a5._1_4_ = 0x10;
  local_a5._5_4_ = 0;
  local_a5._9_4_ = 4;
  local_a5._13_8_ = local_a5 + 1;
  local_90 = 1;
  device_00 = (Ptr<Device> *)local_a5;
  std::allocator<VkPushConstantRange>::allocator((allocator<VkPushConstantRange> *)0x174ab9);
  __l_00._M_len = in_stack_fffffffffffff400;
  __l_00._M_array = (iterator)in_stack_fffffffffffff3f8;
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)
             in_stack_fffffffffffff3f0,__l_00,(allocator_type *)in_stack_fffffffffffff3e8);
  myvk::PipelineLayout::Create
            (in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  std::shared_ptr<myvk::PipelineLayout>::operator=
            ((shared_ptr<myvk::PipelineLayout> *)in_stack_fffffffffffff3c0,
             (shared_ptr<myvk::PipelineLayout> *)in_stack_fffffffffffff3b8);
  std::shared_ptr<myvk::PipelineLayout>::~shared_ptr((shared_ptr<myvk::PipelineLayout> *)0x174b2d);
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::~vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)
             in_stack_fffffffffffff3d0);
  std::allocator<VkPushConstantRange>::~allocator((allocator<VkPushConstantRange> *)local_a5);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)in_stack_fffffffffffff3d0);
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::~allocator(local_6d);
  pCVar4 = (ColorBlendState *)local_58;
  this_02 = (ColorBlendState *)(local_58 + 0x10);
  do {
    this_02 = (ColorBlendState *)(this_02[-1].m_create_info.blendConstants + 2);
    std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)0x174b93);
  } while (this_02 != pCVar4);
  code = this_02;
  memcpy(local_7d8,&DAT_004057c0,0x730);
  code_size = (uint32_t)((ulong)pCVar4 >> 0x20);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x174bd3);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x174be0);
  myvk::ShaderModule::Create(device_00,(uint32_t *)code,code_size);
  puVar3 = local_808;
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff3c0,
             (shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff3b8);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x174c27);
  myvk::ShaderModule::Create(device_00,(uint32_t *)code,code_size);
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff3c0,
             (shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff3b8);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x174c6f);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x174c7c);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d0);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x174cb1);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d0);
  local_840 = local_8a0;
  local_838 = 2;
  std::allocator<VkPipelineShaderStageCreateInfo>::allocator
            ((allocator<VkPipelineShaderStageCreateInfo> *)0x174cf7);
  __l_01._M_len = in_stack_fffffffffffff400;
  __l_01._M_array = in_stack_fffffffffffff3f8;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector(in_stack_fffffffffffff3f0,__l_01,in_stack_fffffffffffff3e8);
  std::allocator<VkPipelineShaderStageCreateInfo>::~allocator(&local_8a1);
  local_b40 = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_b38 = (void *)0x0;
  local_b30 = 0;
  local_b2c = 0;
  local_b28 = 0;
  local_b24 = VK_POLYGON_MODE_FILL;
  local_b20 = 0;
  local_b1c = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_b18 = 0;
  subpass = 0.0;
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  pVVar1 = (pointer)0x0;
  pVVar2 = (pointer)0x0;
  render_pass = (pointer)0x0;
  pipeline_layout = (pointer)0x0;
  std::vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>::
  vector((vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
          *)0x174de6);
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            *)0x174e0c);
  local_a98.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_a98.m_create_info.pNext = (void *)0x0;
  local_a98.m_create_info.flags = 0;
  local_a98.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_a98.m_create_info.primitiveRestartEnable = 0;
  local_a98.m_enable = false;
  local_a70 = 0x15;
  local_a68 = 0;
  local_a60 = 0;
  local_a5c = 0;
  local_a58 = 0;
  local_a50.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a50.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = pVVar1;
  local_a50.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar2;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)0x174eff);
  local_a50.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a50.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pVVar1;
  local_a50.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pVVar2;
  std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
            ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)0x174f25);
  local_a50.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_a50.m_create_info.pNext = (void *)0x0;
  local_a50.m_create_info.flags = 0;
  local_a50.m_create_info.viewportCount = 0;
  local_a50.m_create_info.pViewports = (VkViewport *)0x0;
  local_a50.m_create_info.scissorCount = 0;
  local_a50.m_create_info.pScissors = (VkRect2D *)0x0;
  local_a50.m_enable = false;
  local_9e8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_9e8.m_create_info.pNext = (void *)0x0;
  local_9e8.m_create_info.flags = 0;
  local_9e8.m_create_info.rasterizationSamples = 0;
  local_9e8.m_create_info.sampleShadingEnable = 0;
  local_9e8.m_create_info.minSampleShading = 0.0;
  local_9e8.m_create_info.pSampleMask = (VkSampleMask *)0x0;
  local_9e8.m_create_info.alphaToCoverageEnable = 0;
  local_9e8.m_create_info.alphaToOneEnable = 0;
  local_9e8.m_enable = false;
  local_9b0 = 0x19;
  local_9a8 = 0;
  local_9a0 = 0;
  local_99c = 0;
  local_998 = 0;
  local_994 = 0;
  local_990 = 0;
  local_98c = 0;
  uStack_978 = (undefined4)((ulong)pVVar1 >> 0x20);
  uStack_980 = SUB84(pVVar2,0);
  local_97c = (undefined4)((ulong)pVVar2 >> 0x20);
  local_950 = 0;
  local_94c = 0;
  local_948 = 0;
  local_930 = 0;
  pVStack_988 = pVVar1;
  pVStack_974 = pVVar2;
  pVStack_96c = pVVar1;
  uStack_964 = uStack_980;
  local_960 = local_97c;
  uStack_95c = uStack_978;
  pVStack_958 = pVVar2;
  local_940 = pVVar1;
  pVStack_938 = pVVar2;
  std::
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ::vector((vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
            *)0x1750a7);
  local_928 = 0x1a;
  local_920 = 0;
  local_918 = 0;
  local_914 = 0;
  local_910 = 0;
  local_90c = 0;
  local_908 = 0;
  local_8f0 = 0;
  local_8d8 = 0;
  local_900 = pVVar1;
  pVStack_8f8 = pVVar2;
  local_8e8 = pVVar1;
  pVStack_8e0 = pVVar2;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)0x17512c);
  local_8d0 = 0x1b;
  local_8c8 = 0;
  local_8c0 = 0;
  local_8bc = 0;
  local_8b8 = 0;
  local_8b0 = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable
            ((VertexInputState *)&stack0xfffffffffffff500);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_a98,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_a50,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)&local_b40,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1
            );
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_9e8,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable
            (this_02,(uint32_t)((ulong)puVar3 >> 0x20),(VkBool32)puVar3);
  __a = (allocator_type *)&local_8e8;
  local_b70 = 0;
  local_b6c = 1;
  this_01 = &local_b71;
  std::allocator<VkDynamicState>::allocator((allocator<VkDynamicState> *)0x175238);
  __l_02._M_len = (size_type)pVVar2;
  __l_02._M_array = (iterator)pVVar1;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)this_01,__l_02,__a);
  myvk::GraphicsPipelineState::DynamicState::Enable
            ((DynamicState *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::~vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)in_stack_fffffffffffff3d0);
  std::allocator<VkDynamicState>::~allocator(&local_b71);
  myvk::GraphicsPipeline::Create
            ((Ptr<PipelineLayout> *)pipeline_layout,(Ptr<RenderPass> *)render_pass,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)CONCAT44(in_stack_fffffffffffff4fc,fVar7),
             (GraphicsPipelineState *)CONCAT44(fVar6,fVar5),(uint32_t)subpass);
  std::shared_ptr<myvk::GraphicsPipeline>::operator=
            ((shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffff3c0,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffff3b8);
  std::shared_ptr<myvk::GraphicsPipeline>::~shared_ptr
            ((shared_ptr<myvk::GraphicsPipeline> *)0x1752e8);
  myvk::GraphicsPipelineState::~GraphicsPipelineState(in_stack_fffffffffffff3c0);
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           *)in_stack_fffffffffffff3d0);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x17530f);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x17531c);
  return;
}

Assistant:

void PathTracerViewer::create_gen_graphics_pipeline(const std::shared_ptr<myvk::Device> &device) {
	m_gen_pipeline_layout = myvk::PipelineLayout::Create(device, {m_path_tracer_ptr->GetTargetDescriptorSetLayout()},
	                                                     {{VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t)}});
	constexpr uint32_t kPathTracerViewerGenFragSpirv[] = {
#include "spirv/path_tracer_viewer_gen.frag.u32"
	};

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerGenFragSpirv, sizeof(kPathTracerViewerGenFragSpirv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_gen_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_gen_pipeline_layout, m_gen_render_pass, shader_stages, pipeline_state, 0);
}